

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O0

MyCompiler * __thiscall
MyCompiler::visitTerm
          (MyCompiler *this,Term *ast,
          vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
          *result,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *usedIdents,int *tempIdentCounter)

{
  bool bVar1;
  bool bVar2;
  element_type *result_00;
  reference ppVar3;
  string *local_180;
  undefined1 local_148 [64];
  string asStack_108 [32];
  string asStack_e8 [32];
  MyCompiler local_c8 [48];
  undefined1 local_98 [8];
  string aSecondFactor;
  pair<MyCompiler::MulDivOp,_MyCompiler::Factor> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
  *__range1;
  undefined1 local_50 [3];
  bool moreFactor;
  string aFactor;
  int *tempIdentCounter_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *usedIdents_local;
  vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
  *result_local;
  Term *ast_local;
  string *temp;
  
  result_00 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&ast->pFactor);
  visitFactor((Factor *)local_50,
              (vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
               *)result_00,
              (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)result,(int *)usedIdents);
  bVar1 = std::
          vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
          ::empty(&ast->vMulDivOpFactor);
  if (bVar1) {
    std::__cxx11::string::string((string *)this,(string *)local_50);
  }
  else {
    bVar1 = false;
    std::__cxx11::string::string((string *)this);
    __end1 = std::
             vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
             ::begin(&ast->vMulDivOpFactor);
    item = (pair<MyCompiler::MulDivOp,_MyCompiler::Factor> *)
           std::
           vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
           ::end(&ast->vMulDivOpFactor);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_*,_std::vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>_>
                                       *)&item), bVar2) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_*,_std::vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>_>
               ::operator*(&__end1);
      visitFactor((Factor *)local_98,
                  (vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                   *)&ppVar3->second,
                  (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)result,(int *)usedIdents);
      if (!bVar1) {
        nextTempIdent(local_c8,usedIdents,tempIdentCounter);
        std::__cxx11::string::operator=((string *)this,(string *)local_c8);
        std::__cxx11::string::~string((string *)local_c8);
      }
      std::__cxx11::string::string
                ((string *)local_148,(string *)&(ppVar3->first).super_AbstractAstNode.value);
      local_180 = (string *)this;
      if (!bVar1) {
        local_180 = (string *)local_50;
      }
      std::__cxx11::string::string((string *)(local_148 + 0x20),local_180);
      std::__cxx11::string::string(asStack_108,(string *)local_98);
      std::__cxx11::string::string(asStack_e8,(string *)this);
      std::
      vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
      ::push_back(result,(value_type *)local_148);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)local_148);
      bVar1 = true;
      std::__cxx11::string::~string((string *)local_98);
      __gnu_cxx::
      __normal_iterator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_*,_std::vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>_>
      ::operator++(&__end1);
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  return this;
}

Assistant:

std::string MyCompiler::visitTerm(MyCompiler::Term &ast,
                                  std::vector<std::array<std::string, 4>> &result,
                                  std::unordered_set<std::string> &usedIdents,
                                  int &tempIdentCounter)
{
    std::string aFactor = visitFactor(*ast.pFactor, result, usedIdents, tempIdentCounter);

    if (ast.vMulDivOpFactor.empty())
        return aFactor;

    bool moreFactor = false;
    std::string temp;

    for (auto &item : ast.vMulDivOpFactor)
    {

        std::string aSecondFactor = visitFactor(item.second, result, usedIdents, tempIdentCounter);
        if (!moreFactor)
            temp = nextTempIdent(usedIdents, tempIdentCounter);
        result.push_back({item.first.value,
                          moreFactor ? temp : aFactor,
                          aSecondFactor,
                          temp});
        moreFactor = true;
    }

    return temp;
}